

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall
QByteArray::toHex(QByteArray *__return_storage_ptr__,QByteArray *this,char separator)

{
  long lVar1;
  Data *pDVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  long size;
  
  lVar6 = (this->d).size;
  if (lVar6 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    size = lVar6 * 3 + -1;
    if (separator == '\0') {
      size = lVar6 * 2;
    }
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray(__return_storage_ptr__,size,Uninitialized);
    pDVar2 = (__return_storage_ptr__->d).d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
    }
    pcVar4 = (this->d).ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = &_empty;
    }
    if ((this->d).size != 0) {
      pcVar3 = (__return_storage_ptr__->d).ptr;
      lVar6 = 0;
      uVar5 = 0;
      do {
        pcVar3[lVar6] = "0123456789abcdef"[(byte)pcVar4[uVar5] >> 4];
        lVar1 = lVar6 + 2;
        pcVar3[lVar6 + 1] = "0123456789abcdef"[(byte)pcVar4[uVar5] & 0xf];
        if ((separator != '\0') && (lVar1 < size)) {
          pcVar3[lVar6 + 2] = separator;
          lVar1 = lVar6 + 3;
        }
        lVar6 = lVar1;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(this->d).size);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::toHex(char separator) const
{
    if (isEmpty())
        return QByteArray();

    const qsizetype length = separator ? (size() * 3 - 1) : (size() * 2);
    QByteArray hex(length, Qt::Uninitialized);
    char *hexData = hex.data();
    const uchar *data = (const uchar *)this->data();
    for (qsizetype i = 0, o = 0; i < size(); ++i) {
        hexData[o++] = QtMiscUtils::toHexLower(data[i] >> 4);
        hexData[o++] = QtMiscUtils::toHexLower(data[i] & 0xf);

        if ((separator) && (o < length))
            hexData[o++] = separator;
    }
    return hex;
}